

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O2

atomic<double> * __thiscall
ylt::metric::thread_local_value<double>::get_value(thread_local_value<double> *this,size_t index)

{
  bool bVar1;
  __pointer_type __p2;
  atomic<double> *expected;
  
  if ((this->duplicates_).
      super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start[index]._M_b._M_p == (__pointer_type)0x0) {
    __p2 = (__pointer_type)operator_new(8);
    (__p2->super___atomic_float<double>)._M_fp = 0.0;
    expected = (atomic<double> *)0x0;
    bVar1 = std::atomic<std::atomic<double>_*>::compare_exchange_strong
                      ((this->duplicates_).
                       super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + index,&expected,__p2,seq_cst);
    if (!bVar1) {
      operator_delete(__p2,8);
    }
  }
  return (this->duplicates_).
         super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start[index]._M_b._M_p;
}

Assistant:

auto &get_value(size_t index) {
    if (duplicates_[index] == nullptr) {
      auto ptr = new std::atomic<value_type>(0);

      std::atomic<value_type> *expected = nullptr;
      if (!duplicates_[index].compare_exchange_strong(expected, ptr)) {
        delete ptr;
      }
    }
    return *duplicates_[index];
  }